

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PushUnaryMinus.cpp
# Opt level: O0

TermList Inferences::pushUMinus(UMinus outerMinus,TermList t)

{
  TermList t_00;
  TermList t_01;
  TermList t_02;
  TermList t_03;
  TermList t_04;
  TermList t_05;
  TermList t_06;
  TermList t_07;
  bool bVar1;
  Interpretation IVar2;
  TermList TVar3;
  uint64_t in_RSI;
  int in_EDI;
  Stack<Kernel::TermList> args;
  uint fun;
  Term *term;
  anon_class_8_1_046bb673 wrapMinus;
  Theory *in_stack_fffffffffffffe08;
  Theory *in_stack_fffffffffffffe10;
  uint n;
  Term *in_stack_fffffffffffffe18;
  TermList in_stack_fffffffffffffe20;
  TermList in_stack_fffffffffffffe28;
  Term *in_stack_fffffffffffffe38;
  anon_class_1_0_00000001 *in_stack_fffffffffffffe40;
  IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:860:12),_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:848:12),_Kernel::TermList>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_PushUnaryMinus_cpp:89:16),_Kernel::TermList>_>_>_>_>
  *in_stack_fffffffffffffe98;
  undefined1 local_160 [24];
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:848:12),_Kernel::TermList>_>
  local_148;
  Term *local_128;
  Term *pTStack_120;
  MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:860:12),_Kernel::TermList>
  in_stack_fffffffffffffef0;
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:848:12),_Kernel::TermList>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_PushUnaryMinus_cpp:89:16),_Kernel::TermList>_>
  in_stack_ffffffffffffff08;
  Stack<Kernel::TermList> local_d0;
  uint64_t local_b0;
  uint64_t local_a8;
  uint64_t local_a0;
  uint64_t local_98;
  uint64_t local_90;
  uint64_t local_88;
  uint64_t local_80;
  uint64_t local_78;
  uint64_t local_70;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint local_34;
  Term *local_30;
  UMinus outerMinus_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  outerMinus_00 = (UMinus)((ulong)&stack0xffffffffffffffec >> 0x20);
  bVar1 = Kernel::TermList::isVar((TermList *)in_stack_fffffffffffffe10);
  if (bVar1) {
    TVar3 = pushUMinus::anon_class_8_1_046bb673::operator()
                      (in_stack_fffffffffffffe20._content,in_stack_fffffffffffffe28);
    return (TermList)TVar3._content;
  }
  Kernel::TermList::term((TermList *)0x8277e8);
  bVar1 = Kernel::Term::isSort((Term *)0x8277f0);
  if (!bVar1) {
    local_30 = Kernel::TermList::term((TermList *)0x827818);
    local_34 = Kernel::Term::functor(local_30);
    bVar1 = Kernel::Theory::isInterpretedFunction(in_stack_fffffffffffffe08,0);
    if (bVar1) {
      IVar2 = Kernel::Theory::interpretFunction
                        (in_stack_fffffffffffffe10,(uint)((ulong)in_stack_fffffffffffffe08 >> 0x20))
      ;
      n = (uint)((ulong)in_stack_fffffffffffffe10 >> 0x20);
      switch(IVar2) {
      case INT_UNARY_MINUS:
        if (in_EDI == 3) {
          local_40 = (uint64_t)Kernel::Term::termArg(in_stack_fffffffffffffe18,n);
          t_00._content._4_4_ = in_EDI;
          t_00._content._0_4_ = in_stack_ffffffffffffffe8;
          TVar3 = pushUMinus(outerMinus_00,t_00);
          return (TermList)TVar3._content;
        }
        TVar3 = Kernel::Term::termArg(in_stack_fffffffffffffe18,n);
        return (TermList)TVar3._content;
      case INT_PLUS:
        if (in_EDI != 3) {
          local_50 = (uint64_t)Kernel::Term::termArg(in_stack_fffffffffffffe18,n);
          t_01._content._4_4_ = in_EDI;
          t_01._content._0_4_ = in_stack_ffffffffffffffe8;
          local_48 = (uint64_t)pushUMinus(outerMinus_00,t_01);
          local_60 = (uint64_t)Kernel::Term::termArg(in_stack_fffffffffffffe18,n);
          t_02._content._4_4_ = in_EDI;
          t_02._content._0_4_ = in_stack_ffffffffffffffe8;
          local_58 = (uint64_t)pushUMinus(outerMinus_00,t_02);
          TVar3 = Kernel::NumTraits<Kernel::IntegerConstantType>::add
                            (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
          return (TermList)TVar3._content;
        }
        break;
      default:
        break;
      case RAT_UNARY_MINUS:
        if (in_EDI == 3) {
          local_68 = (uint64_t)Kernel::Term::termArg(in_stack_fffffffffffffe18,n);
          t_03._content._4_4_ = in_EDI;
          t_03._content._0_4_ = in_stack_ffffffffffffffe8;
          TVar3 = pushUMinus(outerMinus_00,t_03);
          return (TermList)TVar3._content;
        }
        TVar3 = Kernel::Term::termArg(in_stack_fffffffffffffe18,n);
        return (TermList)TVar3._content;
      case RAT_PLUS:
        if (in_EDI != 3) {
          local_78 = (uint64_t)Kernel::Term::termArg(in_stack_fffffffffffffe18,n);
          t_04._content._4_4_ = in_EDI;
          t_04._content._0_4_ = in_stack_ffffffffffffffe8;
          local_70 = (uint64_t)pushUMinus(outerMinus_00,t_04);
          local_88 = (uint64_t)Kernel::Term::termArg(in_stack_fffffffffffffe18,n);
          t_05._content._4_4_ = in_EDI;
          t_05._content._0_4_ = in_stack_ffffffffffffffe8;
          local_80 = (uint64_t)pushUMinus(outerMinus_00,t_05);
          TVar3 = Kernel::NumTraits<Kernel::RationalConstantType>::add
                            (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
          return (TermList)TVar3._content;
        }
        break;
      case REAL_UNARY_MINUS:
        if (in_EDI == 3) {
          local_90 = (uint64_t)Kernel::Term::termArg(in_stack_fffffffffffffe18,n);
          t_06._content._4_4_ = in_EDI;
          t_06._content._0_4_ = in_stack_ffffffffffffffe8;
          TVar3 = pushUMinus(outerMinus_00,t_06);
          return (TermList)TVar3._content;
        }
        TVar3 = Kernel::Term::termArg(in_stack_fffffffffffffe18,n);
        return (TermList)TVar3._content;
      case REAL_PLUS:
        if (in_EDI != 3) {
          local_a0 = (uint64_t)Kernel::Term::termArg(in_stack_fffffffffffffe18,n);
          TVar3._content._4_4_ = in_EDI;
          TVar3._content._0_4_ = in_stack_ffffffffffffffe8;
          local_98 = (uint64_t)pushUMinus(outerMinus_00,TVar3);
          local_b0 = (uint64_t)Kernel::Term::termArg(in_stack_fffffffffffffe18,n);
          t_07._content._4_4_ = in_EDI;
          t_07._content._0_4_ = in_stack_ffffffffffffffe8;
          local_a8 = (uint64_t)pushUMinus(outerMinus_00,t_07);
          TVar3 = Kernel::NumTraits<Kernel::RealConstantType>::add
                            (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
          return (TermList)TVar3._content;
        }
      }
    }
    Kernel::anon_class_1_0_00000001::operator()(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38)
    ;
    Kernel::anon_class_1_0_00000001::operator()(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38)
    ;
    Lib::
    IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Kernel::$_1::operator()(Kernel::Term_const*)const::{lambda(auto:1)#1},Kernel::TermList>>
    ::map<Inferences::pushUMinus(Inferences::UMinus,Kernel::TermList)::__0>(&local_148,local_160);
    Lib::operator()((IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Kernel_TermIterators_hpp:860:12),_Kernel::TermList>_>
                     )in_stack_fffffffffffffef0,in_stack_ffffffffffffff08);
    Lib::
    IterTraits<Lib::CatIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/TermIterators.hpp:860:12),_Kernel::TermList>_>,_Lib::IterTraits<Lib::IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Kernel/TermIterators.hpp:848:12),_Kernel::TermList>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/PushUnaryMinus.cpp:89:16),_Kernel::TermList>_>_>_>_>
    ::collect<Lib::Stack>(in_stack_fffffffffffffe98);
    Lib::Stack<Kernel::TermList>::begin(&local_d0);
    Kernel::Term::create(pTStack_120,(TermList *)local_128);
    Kernel::TermList::TermList((TermList *)pTStack_120,local_128);
    TVar3 = pushUMinus::anon_class_8_1_046bb673::operator()
                      ((anon_class_8_1_046bb673 *)local_148._iter._func.term,
                       (TermList)local_148._iter._inner._0_8_);
    Lib::Stack<Kernel::TermList>::~Stack((Stack<Kernel::TermList> *)pTStack_120);
    return (TermList)TVar3._content;
  }
  return (TermList)in_RSI;
}

Assistant:

TermList pushUMinus(UMinus outerMinus, TermList t) 
{
  auto wrapMinus = [&](TermList t) 
  {
    switch (outerMinus) {
      case UMinus::Int : return IntTraits::minus(t);
      case UMinus::Rat : return RatTraits::minus(t);
      case UMinus::Real: return RealTraits::minus(t);
      case UMinus::None: return t;
      default:
        ASSERTION_VIOLATION;
    }
    ASSERTION_VIOLATION
  };

  if (t.isVar()) {
    return wrapMinus(t);
  } else if(t.term()->isSort()){
    return t;
  } else {
    auto term = t.term();
auto fun = term->functor();
    if (theory->isInterpretedFunction(fun)) {
      switch (theory->interpretFunction(fun)) {
#define CASE(Num)                                                                                             \
        case Num##Traits::minusI:                                                                             \
        {                                                                                                     \
          if(outerMinus == UMinus::None) {                                                                    \
            return pushUMinus(UMinus::Num, term->termArg(0));                                                 \
          } else {                                                                                            \
            ASS_EQ(outerMinus, UMinus::Num)                                                                   \
            return term->termArg(0);                                                                          \
          }                                                                                                   \
        }                                                                                                     \
        case Num##Traits::addI:                                                                               \
        if (outerMinus != UMinus::None) {                                                                     \
          ASS_EQ(outerMinus, UMinus::Num);                                                                    \
          return Num##Traits::add(                                                                            \
              pushUMinus(UMinus::Num, term->termArg(0)),                                                      \
              pushUMinus(UMinus::Num, term->termArg(1)));                                                     \
        } else { break; }
        CASE(Int)
        CASE(Rat)
        CASE(Real)
        default: {}
      }
    }
    auto args = concatIters(
        typeArgIter(term),
        termArgIter(term)
          .map([&](auto t) { return pushUMinus(UMinus::None, t); }))
      .template collect<Stack>();

    return wrapMinus(TermList(Term::create(term, args.begin())));
  }
}
PushUnaryMinus::~PushUnaryMinus() {}

Clause* PushUnaryMinus::simplify(Clause* cl_) 
{
  DEBUG("in:  ", *cl_)
  if (cl_->isTheoryAxiom()) 
    return cl_;

  auto& cl = *cl_;
  Stack<Literal*> out(cl.size());

  bool changed = false;

  for (unsigned i = 0; i < cl.size(); i++) {
    auto litIn = cl[i];
    auto litStack = concatIters(
        typeArgIter(litIn),
        termArgIter(litIn)
          .map([&](auto tIn) {
            auto tOut = pushUMinus(UMinus::None, tIn);
            changed = changed || tIn != tOut;
            return tOut;
          })
        ).template collect<Stack>();
    if(changed){
      auto litOut = Literal::create(litIn, litStack.begin());
      out.push(litOut);
    } else {
      out.push(litIn);
    }
  }

  if (!changed) {
    return cl_;
  } else {
    auto result = Clause::fromStack(out, SimplifyingInference1(InferenceRule::EVALUATION, cl_));
    DEBUG("out: ", *result)
    return result;
  }
}


}